

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantities_testing_c.h
# Opt level: O2

void Quantities_init_am_matrices_(Quantities *quan,Dimensions dims,Env *env)

{
  Pointer *p;
  double dVar1;
  Bool_t BVar2;
  int iVar3;
  int iVar4;
  P *pPVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t n;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  
  n = (size_t)(dims.nm * dims.na * 8);
  BVar2 = Env_cuda_is_using_device(env);
  Pointer_create(&quan->a_from_m,n,BVar2);
  p = &quan->m_from_a;
  BVar2 = Env_cuda_is_using_device(env);
  Pointer_create(p,n,BVar2);
  Pointer_allocate(&quan->a_from_m);
  Pointer_allocate(p);
  iVar6 = 0;
  iVar3 = 0;
  if (0 < dims.na) {
    iVar3 = dims.na;
  }
  iVar4 = 0;
  if (0 < dims.nm) {
    iVar4 = dims.nm;
  }
  for (; iVar6 != 8; iVar6 = iVar6 + 1) {
    for (iVar9 = 0; iVar9 != iVar4; iVar9 = iVar9 + 1) {
      for (iVar10 = 0; iVar3 != iVar10; iVar10 = iVar10 + 1) {
        pPVar5 = Pointer_h(&quan->a_from_m);
        pPVar5 = ref_a_from_m(pPVar5,dims,iVar9,iVar10,iVar6);
        *pPVar5 = 0.0;
      }
    }
  }
  for (iVar6 = 0; iVar6 != 8; iVar6 = iVar6 + 1) {
    iVar9 = 0;
    while (iVar10 = iVar9, iVar3 != iVar10) {
      iVar9 = iVar10 + 1;
      pPVar5 = Pointer_h(&quan->a_from_m);
      pPVar5 = ref_a_from_m(pPVar5,dims,dims.nm + -1,iVar10,iVar6);
      *pPVar5 = (double)(iVar9 / dims.nm) + *pPVar5;
      if (iVar9 % dims.nm != 0) {
        pPVar5 = Pointer_h(&quan->a_from_m);
        pPVar5 = ref_a_from_m(pPVar5,dims,0,iVar10,iVar6);
        *pPVar5 = *pPVar5 + -1.0;
        pPVar5 = Pointer_h(&quan->a_from_m);
        pPVar5 = ref_a_from_m(pPVar5,dims,iVar9 % dims.nm,iVar10,iVar6);
        *pPVar5 = *pPVar5 + 1.0;
      }
    }
  }
  iVar6 = dims.nm + -2;
  iVar9 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar9 != 8; iVar9 = iVar9 + 1) {
    iVar10 = 0;
    while (iVar8 = iVar10, iVar8 != iVar6) {
      iVar11 = iVar8;
      for (iVar7 = 0; iVar10 = iVar8 + 1, iVar3 != iVar7; iVar7 = iVar7 + 1) {
        dVar1 = (double)(iVar11 % 0x11 + 0x15);
        pPVar5 = Pointer_h(&quan->a_from_m);
        pPVar5 = ref_a_from_m(pPVar5,dims,iVar8,iVar7,iVar9);
        *pPVar5 = *pPVar5 - dVar1;
        pPVar5 = Pointer_h(&quan->a_from_m);
        pPVar5 = ref_a_from_m(pPVar5,dims,iVar8 + 1,iVar7,iVar9);
        *pPVar5 = dVar1 + dVar1 + *pPVar5;
        pPVar5 = Pointer_h(&quan->a_from_m);
        pPVar5 = ref_a_from_m(pPVar5,dims,iVar8 + 2,iVar7,iVar9);
        *pPVar5 = *pPVar5 - dVar1;
        iVar11 = iVar11 + dims.nm;
      }
    }
  }
  for (iVar6 = 0; iVar6 != 8; iVar6 = iVar6 + 1) {
    for (iVar9 = 0; iVar9 != iVar4; iVar9 = iVar9 + 1) {
      for (iVar10 = 0; iVar3 != iVar10; iVar10 = iVar10 + 1) {
        pPVar5 = Pointer_h(p);
        pPVar5 = ref_m_from_a(pPVar5,dims,iVar9,iVar10,iVar6);
        *pPVar5 = 0.0;
      }
    }
  }
  for (iVar6 = 0; iVar6 != 8; iVar6 = iVar6 + 1) {
    iVar9 = 0;
    while (iVar10 = iVar9, iVar4 != iVar10) {
      iVar9 = iVar10 + 1;
      pPVar5 = Pointer_h(p);
      pPVar5 = ref_m_from_a(pPVar5,dims,iVar10,dims.na + -1,iVar6);
      *pPVar5 = (double)(iVar9 / dims.na) + *pPVar5;
      if (iVar9 % dims.na != 0) {
        pPVar5 = Pointer_h(p);
        pPVar5 = ref_m_from_a(pPVar5,dims,iVar10,0,iVar6);
        *pPVar5 = *pPVar5 + -1.0;
        pPVar5 = Pointer_h(p);
        pPVar5 = ref_m_from_a(pPVar5,dims,iVar10,iVar9 % dims.na,iVar6);
        *pPVar5 = *pPVar5 + 1.0;
      }
    }
  }
  iVar9 = 0;
  iVar6 = dims.na + -2;
  if (dims.na + -2 < 1) {
    iVar6 = iVar9;
  }
  for (; iVar9 != 8; iVar9 = iVar9 + 1) {
    for (iVar10 = 0; iVar10 != iVar4; iVar10 = iVar10 + 1) {
      iVar8 = 0;
      iVar11 = iVar10;
      iVar7 = iVar6;
      while (bVar12 = iVar7 != 0, iVar7 = iVar7 + -1, bVar12) {
        dVar1 = (double)(iVar11 % 0x13 + 0x25);
        pPVar5 = Pointer_h(p);
        pPVar5 = ref_m_from_a(pPVar5,dims,iVar10,iVar8,iVar9);
        *pPVar5 = *pPVar5 - dVar1;
        pPVar5 = Pointer_h(p);
        pPVar5 = ref_m_from_a(pPVar5,dims,iVar10,iVar8 + 1,iVar9);
        *pPVar5 = dVar1 + dVar1 + *pPVar5;
        pPVar5 = Pointer_h(p);
        pPVar5 = ref_m_from_a(pPVar5,dims,iVar10,iVar8 + 2,iVar9);
        *pPVar5 = *pPVar5 - dVar1;
        iVar11 = iVar11 + dims.nm;
        iVar8 = iVar8 + 1;
      }
    }
  }
  for (iVar6 = 0; iVar6 != 8; iVar6 = iVar6 + 1) {
    for (iVar9 = 0; iVar9 != iVar4; iVar9 = iVar9 + 1) {
      for (iVar10 = 0; iVar3 != iVar10; iVar10 = iVar10 + 1) {
        pPVar5 = Pointer_h(p);
        pPVar5 = ref_m_from_a(pPVar5,dims,iVar9,iVar10,iVar6);
        *pPVar5 = *pPVar5 * 0.125;
        pPVar5 = Pointer_h(p);
        pPVar5 = ref_m_from_a(pPVar5,dims,iVar9,iVar10,iVar6);
        *pPVar5 = *pPVar5 / (double)(1 << ((byte)iVar10 & 7));
      }
    }
  }
  Pointer_update_d(&quan->a_from_m);
  Pointer_update_d(p);
  return;
}

Assistant:

void Quantities_init_am_matrices_( Quantities*       quan,
                                   const Dimensions  dims,
                                   Env*              env )
{
  /*---Declarations---*/

  int im     = 0;
  int ia     = 0;
  int i      = 0;
  int octant = 0;

  /*---Allocate arrays---*/

  Pointer_create( & quan->a_from_m, dims.nm * dims.na * NOCTANT,
                                             Env_cuda_is_using_device( env ) );
  Pointer_create( & quan->m_from_a, dims.nm * dims.na * NOCTANT,
                                             Env_cuda_is_using_device( env ) );

  Pointer_allocate( & quan->a_from_m );
  Pointer_allocate( & quan->m_from_a );

  /*-----------------------------*/
  /*---Set entries of a_from_m---*/
  /*-----------------------------*/

  /*---These two matrices are set in a special way so as to map a vector
       whose values satisfy a linear relationship v_i = a * i + b
       are mapped to another vector with same property.  This is to facilitate
       being able to have an analytical solution for the sweep.
  ---*/

  /*---First set to zero---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm;     ++im )
  for( ia=0;     ia<dims.na;     ++ia )
  {
    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, im, ia, octant )
                                                                   = P_zero();
  }

  /*---Map a linear vector of values to a similar linear vector of values---*/

  /*---The input state vector in the moment dimension is contrived to
       satisfy vi[im] = 1 + im, an affine function, possibly times a constant.
       The following matrix is artifically contrived to send this to
       a result satisfying, in angle, vl[ia] = 1 + ia, possibly times a
       constant.
  ---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( i=0;      i<dims.na;      ++i )
  {
    const int quot = ( i + 1 ) / dims.nm;
    const int rem  = ( i + 1 ) % dims.nm;

    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, dims.nm-1, i, octant )
                                                                       += quot;
    if( rem != 0 )
    {
      *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, 0,   i, octant )
                                                                   += -P_one();
      *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, rem, i, octant )
                                                                   +=  P_one();
    }
  }

  /*---Fill matrix with entries that leave linears unaffected---*/

  /*---This is to create a more dense, nontrivial matrix, with additions
       to the rows that are guaranteed to send affine functions to zero.
  ---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm-2;   ++im )
  for( ia=0;     ia<dims.na;     ++ia )
  {
    const int randvalue = 21 + ( im + dims.nm * ia ) % 17;

    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, im+0, ia, octant ) +=
                                                          -P_one() * randvalue;
    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, im+1, ia, octant ) +=
                                                         2*P_one() * randvalue;
    *ref_a_from_m( Pointer_h( & quan->a_from_m ), dims, im+2, ia, octant ) +=
                                                          -P_one() * randvalue;
  }

  /*-----------------------------*/
  /*---Set entries of m_from_a---*/
  /*-----------------------------*/

  /*---First set to zero---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm;     ++im )
  for( ia=0;     ia<dims.na;     ++ia )
  {
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia, octant )
                                                                    = P_zero();
  }

  /*---Map a linear vector of values to a similar linear vector of values---*/

  /*---As previously, send functions vl[ia] = 1 + ia to functions
       vo[im] = 1 + im, subject to possible constant scalings
       and also to a power-of-two angle scalefactor adjustment
       designed to make the test more rigorous.
  ---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( i=0;      i<dims.nm;      ++i )
  {
    const int quot = ( i + 1 ) / dims.na;
    const int rem  = ( i + 1 ) % dims.na;

    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, i, dims.na-1, octant )
                                                                       += quot;
    if( rem != 0 )
    {
      *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, i, 0  , octant )
                                                                   += -P_one();
      *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, i, rem, octant )
                                                                   +=  P_one();
    }
  }

  /*---Fill matrix with entries that leave linears unaffected---*/

  /*---As before, create more complicated matrix by adding to rows
       entries that do not affect the scaled-affine input values expected.
  ---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm;     ++im )
  for( ia=0;     ia<dims.na-2;   ++ia )
  {
    const int randvalue = 37 + ( im + dims.nm * ia ) % 19;

    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia+0, octant ) +=
                                                          -P_one() * randvalue;
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia+1, octant ) +=
                                                         2*P_one() * randvalue;
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia+2, octant ) +=
                                                          -P_one() * randvalue;
  }

  /*---Scale matrix to compensate for 8 octants and also angle scale factor---*/

  for( octant=0; octant<NOCTANT; ++octant )
  for( im=0;     im<dims.nm;     ++im )
  for( ia=0;     ia<dims.na;     ++ia )
  {
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia, octant )
                                                                    /= NOCTANT;
    *ref_m_from_a( Pointer_h( & quan->m_from_a ), dims, im, ia, octant )
                                 /= Quantities_scalefactor_angle_( dims, ia );
  }

  Pointer_update_d( & quan->a_from_m );
  Pointer_update_d( & quan->m_from_a );

}